

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O0

bikes_allowed_t parse_bike_allowance(char *value)

{
  int iVar1;
  char *value_local;
  
  iVar1 = strcmp(value,"0");
  if ((iVar1 == 0) || (iVar1 = strcmp(value,""), iVar1 == 0)) {
    return BA_UNKNOWN;
  }
  iVar1 = strcmp(value,"1");
  if (iVar1 == 0) {
    return BA_POSSIBLE;
  }
  iVar1 = strcmp(value,"2");
  if (iVar1 == 0) {
    return BA_NOT_POSSIBLE;
  }
  return BA_NOT_SET;
}

Assistant:

bikes_allowed_t parse_bike_allowance(const char *value) {
    if (strcmp(value, "0") == 0 || strcmp(value, "") == 0)
        return BA_UNKNOWN;
    else if (strcmp(value, "1") == 0)
        return BA_POSSIBLE;
    else if (strcmp(value, "2") == 0)
        return BA_NOT_POSSIBLE;
    else
        return BA_NOT_SET;
}